

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O0

void mdct_forward(mdct_lookup *init,float *in,float *out)

{
  int iVar1;
  long lVar2;
  int points;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  undefined8 uStack_70;
  float fStack_68;
  int local_64;
  float *pfStack_60;
  int i;
  float *T;
  float *x1;
  float *x0;
  float r1;
  float r0;
  float *w2;
  float *w;
  int n8;
  int n4;
  int n2;
  int n;
  float *out_local;
  float *in_local;
  mdct_lookup *init_local;
  
  iVar1 = init->n;
  points = iVar1 >> 1;
  iVar3 = iVar1 >> 3;
  lVar2 = -((long)iVar1 * 4 + 0xfU & 0xfffffffffffffff0);
  pfVar4 = (float *)((long)&fStack_68 + lVar2);
  pfVar5 = pfVar4 + points;
  T = in + (long)points + (long)(iVar1 >> 2) + 1;
  pfStack_60 = init->trig + points;
  x1 = in + (long)points + (long)(iVar1 >> 2);
  for (local_64 = 0; local_64 < iVar3; local_64 = local_64 + 2) {
    pfVar6 = pfStack_60 + -2;
    fVar7 = x1[-2] + *T;
    fVar8 = x1[-4] + T[2];
    pfVar5[local_64] = fVar8 * pfStack_60[-1] + fVar7 * *pfVar6;
    pfVar5[local_64 + 1] = fVar8 * *pfVar6 + -(fVar7 * pfStack_60[-1]);
    T = T + 4;
    pfStack_60 = pfVar6;
    x1 = x1 + -4;
    x0._0_4_ = fVar8;
    x0._4_4_ = fVar7;
  }
  T = in + 1;
  for (; local_64 < points - iVar3; local_64 = local_64 + 2) {
    pfVar6 = pfStack_60 + -2;
    fVar7 = x1[-2] - *T;
    fVar8 = x1[-4] - T[2];
    pfVar5[local_64] = fVar8 * pfStack_60[-1] + fVar7 * *pfVar6;
    pfVar5[local_64 + 1] = fVar8 * *pfVar6 + -(fVar7 * pfStack_60[-1]);
    T = T + 4;
    pfStack_60 = pfVar6;
    x1 = x1 + -4;
    x0._0_4_ = fVar8;
    x0._4_4_ = fVar7;
  }
  x1 = in + iVar1;
  for (; local_64 < points; local_64 = local_64 + 2) {
    pfVar6 = pfStack_60 + -2;
    fVar7 = -x1[-2] - *T;
    fVar8 = -x1[-4] - T[2];
    pfVar5[local_64] = fVar8 * pfStack_60[-1] + fVar7 * *pfVar6;
    pfVar5[local_64 + 1] = fVar8 * *pfVar6 + -(fVar7 * pfStack_60[-1]);
    T = T + 4;
    pfStack_60 = pfVar6;
    x1 = x1 + -4;
    x0._0_4_ = fVar8;
    x0._4_4_ = fVar7;
  }
  _r1 = pfVar5;
  w2 = pfVar4;
  w._0_4_ = iVar3;
  w._4_4_ = iVar1 >> 2;
  n8 = points;
  n4 = iVar1;
  _n2 = out;
  out_local = in;
  in_local = (float *)init;
  *(undefined8 *)((long)&uStack_70 + lVar2) = 0x2c54d3;
  mdct_butterflies(init,pfVar4 + points,points);
  pfVar5 = in_local;
  pfVar4 = w2;
  *(undefined8 *)((long)&uStack_70 + lVar2) = 0x2c54e0;
  mdct_bitreverse((mdct_lookup *)pfVar5,pfVar4);
  pfStack_60 = (float *)(*(long *)(in_local + 2) + (long)n8 * 4);
  x1 = _n2 + n8;
  for (local_64 = 0; local_64 < w._4_4_; local_64 = local_64 + 1) {
    x1 = x1 + -1;
    _n2[local_64] = (*w2 * *pfStack_60 + w2[1] * pfStack_60[1]) * in_local[6];
    *x1 = (*w2 * pfStack_60[1] + -(w2[1] * *pfStack_60)) * in_local[6];
    w2 = w2 + 2;
    pfStack_60 = pfStack_60 + 2;
  }
  return;
}

Assistant:

void mdct_forward(mdct_lookup *init, DATA_TYPE *in, DATA_TYPE *out){
  int n=init->n;
  int n2=n>>1;
  int n4=n>>2;
  int n8=n>>3;
  DATA_TYPE *w=alloca(n*sizeof(*w)); /* forward needs working space */
  DATA_TYPE *w2=w+n2;

  /* rotate */

  /* window + rotate + step 1 */

  REG_TYPE r0;
  REG_TYPE r1;
  DATA_TYPE *x0=in+n2+n4;
  DATA_TYPE *x1=x0+1;
  DATA_TYPE *T=init->trig+n2;

  int i=0;

  for(i=0;i<n8;i+=2){
    x0 -=4;
    T-=2;
    r0= x0[2] + x1[0];
    r1= x0[0] + x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }

  x1=in+1;

  for(;i<n2-n8;i+=2){
    T-=2;
    x0 -=4;
    r0= x0[2] - x1[0];
    r1= x0[0] - x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }

  x0=in+n;

  for(;i<n2;i+=2){
    T-=2;
    x0 -=4;
    r0= -x0[2] - x1[0];
    r1= -x0[0] - x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }


  mdct_butterflies(init,w+n2,n2);
  mdct_bitreverse(init,w);

  /* roatate + window */

  T=init->trig+n2;
  x0=out+n2;

  for(i=0;i<n4;i++){
    x0--;
    out[i] =MULT_NORM((w[0]*T[0]+w[1]*T[1])*init->scale);
    x0[0]  =MULT_NORM((w[0]*T[1]-w[1]*T[0])*init->scale);
    w+=2;
    T+=2;
  }
}